

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlDocument::TiXmlDocument(TiXmlDocument *this)

{
  TiXmlDocument *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,TINYXML_DOCUMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDocument_0030ac28;
  TiXmlString::TiXmlString(&this->errorDesc);
  TiXmlCursor::TiXmlCursor(&this->errorLocation);
  this->tabsize = 4;
  this->useMicrosoftBOM = false;
  ClearError(this);
  return;
}

Assistant:

TiXmlDocument::TiXmlDocument() : TiXmlNode( TiXmlNode::TINYXML_DOCUMENT )
{
	tabsize = 4;
	useMicrosoftBOM = false;
	ClearError();
}